

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvariant.cpp
# Opt level: O2

QRectF * __thiscall QVariant::toRectF(QRectF *__return_storage_ptr__,QVariant *this)

{
  qvariant_cast<QRectF>(__return_storage_ptr__,this);
  return __return_storage_ptr__;
}

Assistant:

QRectF QVariant::toRectF() const
{
    return qvariant_cast<QRectF>(*this);
}